

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O1

LPCSTR __thiscall NpyArray::SaveNPZ(NpyArray *this,string *zipname,string *varname,bool bAppend)

{
  size_t sVar1;
  size_t sVar2;
  pointer pcVar3;
  pointer __n;
  unsigned_short rhs;
  undefined4 uVar4;
  uint uVar5;
  FILE *__stream;
  char *pcVar6;
  pointer pcVar7;
  byte bVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  uint rhs_00;
  bool bVar10;
  uint16_t nrecs;
  vector<char,_std::allocator<char>_> localHeader;
  vector<char,_std::allocator<char>_> globalHeader;
  vector<char,_std::allocator<char>_> footer;
  size_t globalHeaderOffset;
  vector<char,_std::allocator<char>_> npyHeader;
  uint16_t local_ea;
  vector<char,_std::allocator<char>_> local_e8;
  vector<char,_std::allocator<char>_> local_c8;
  vector<char,_std::allocator<char>_> local_a8;
  size_t local_90;
  vector<char,_std::allocator<char>_> local_88;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_ea = 0;
  local_90 = 0;
  local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000009,bAppend) == 0) {
LAB_00117fe9:
    __stream = fopen((zipname->_M_dataplus)._M_p,"wb");
  }
  else {
    __stream = fopen((zipname->_M_dataplus)._M_p,"r+b");
    if (__stream == (FILE *)0x0) goto LAB_00117fe9;
    pcVar6 = ParseFooterZIP((FILE *)__stream,&local_ea,(size_t *)&local_88,&local_90);
    sVar1 = local_90;
    if (pcVar6 == (LPCSTR)0x0) {
      fseek(__stream,local_90,0);
      __n = local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start;
      std::vector<char,_std::allocator<char>_>::resize
                (&local_c8,
                 (size_type)
                 local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      pcVar7 = (pointer)fread(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,1,(size_t)__n,__stream);
      pcVar6 = "error: header read error while adding to existing zip";
      bVar10 = pcVar7 == __n;
      if (bVar10) {
        fseek(__stream,sVar1,0);
        bVar10 = true;
      }
    }
    else {
      bVar10 = false;
    }
    if (!bVar10) goto LAB_00118413;
  }
  if (__stream == (FILE *)0x0) {
    pcVar6 = "error: unable to open file";
  }
  else {
    bVar8 = this->type >> 7;
    CreateHeaderNPY(&local_88,&this->shape,(this->type ^ bVar8) - bVar8,this->wordSize);
    sVar1 = this->wordSize;
    sVar2 = this->numValues;
    uVar9 = (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    uVar4 = crc32(0,local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,uVar9 & 0xffffffff);
    uVar5 = crc32(uVar4,this->data,(int)this->wordSize * (int)this->numValues);
    std::__cxx11::string::append((char *)varname);
    local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    add(&local_e8,"PK");
    add<unsigned_short>(&local_e8,0x403);
    add<unsigned_short>(&local_e8,0x14);
    add<unsigned_short>(&local_e8,0);
    add<unsigned_short>(&local_e8,0);
    add<unsigned_short>(&local_e8,0);
    add<unsigned_short>(&local_e8,0);
    add<unsigned_int>(&local_e8,uVar5);
    uVar5 = (int)uVar9 + (int)sVar1 * (int)sVar2;
    add<unsigned_int>(&local_e8,uVar5);
    add<unsigned_int>(&local_e8,uVar5);
    add<unsigned_short>(&local_e8,(unsigned_short)varname->_M_string_length);
    add<unsigned_short>(&local_e8,0);
    pcVar3 = (varname->_M_dataplus)._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + varname->_M_string_length);
    std::vector<char,std::allocator<char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((vector<char,std::allocator<char>> *)&local_e8,
               local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,local_50,local_50 + local_48);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    add(&local_c8,"PK");
    add<unsigned_short>(&local_c8,0x201);
    add<unsigned_short>(&local_c8,0x14);
    std::vector<char,std::allocator<char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((vector<char,std::allocator<char>> *)&local_c8,
               local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,
               local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + 4,
               local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + 0x1e);
    add<unsigned_short>(&local_c8,0);
    add<unsigned_short>(&local_c8,0);
    add<unsigned_short>(&local_c8,0);
    add<unsigned_int>(&local_c8,0);
    rhs_00 = (uint)local_90;
    add<unsigned_int>(&local_c8,rhs_00);
    pcVar3 = (varname->_M_dataplus)._M_p;
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + varname->_M_string_length);
    std::vector<char,std::allocator<char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((vector<char,std::allocator<char>> *)&local_c8,
               local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,local_70,local_70 + local_68);
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    add(&local_a8,"PK");
    add<unsigned_short>(&local_a8,0x605);
    add<unsigned_short>(&local_a8,0);
    add<unsigned_short>(&local_a8,0);
    rhs = local_ea + 1;
    add<unsigned_short>(&local_a8,rhs);
    add<unsigned_short>(&local_a8,rhs);
    add<unsigned_int>(&local_a8,
                      (int)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                      (int)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
    add<unsigned_int>(&local_a8,
                      (rhs_00 + uVar5 +
                      (int)local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish) -
                      (int)local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
    add<unsigned_short>(&local_a8,0);
    fwrite(local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start,1,
           (long)local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,__stream);
    fwrite(local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start,1,
           (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,__stream);
    fwrite(this->data,this->wordSize,this->numValues,__stream);
    fwrite(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start,1,
           (long)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,__stream);
    fwrite(local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start,1,
           (long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,__stream);
    fclose(__stream);
    if (local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    pcVar6 = (LPCSTR)0x0;
  }
LAB_00118413:
  if (local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return pcVar6;
}

Assistant:

LPCSTR NpyArray::SaveNPZ(std::string zipname, std::string varname, bool bAppend) const
{
	FILE* fp;
	uint16_t nrecs = 0;
	size_t globalHeaderOffset = 0;
	std::vector<char> globalHeader;
	if (bAppend && (fp=fopen(zipname.c_str(), "r+b")) != NULL) {
		// zip file exists, add a new NPY array to it;
		// first read the footer and parse the offset and size of the global header
		// then read and store the global header;
		// the new data will be written at the start of the global header,
		// then append the global header and footer below it
		size_t globalHeaderSize;
		LPCSTR ret = ParseFooterZIP(fp, nrecs, globalHeaderSize, globalHeaderOffset);
		if (ret != NULL)
			return ret;
		fseek(fp, (long)globalHeaderOffset, SEEK_SET);
		globalHeader.resize(globalHeaderSize);
		size_t res = fread(globalHeader.data(), sizeof(char), globalHeaderSize, fp);
		if (res != globalHeaderSize)
			return "error: header read error while adding to existing zip";
		fseek(fp, (long)globalHeaderOffset, SEEK_SET);
	} else {
		fp = fopen(zipname.c_str(), "wb");
	}
	if (!fp)
		return "error: unable to open file";

	const std::vector<char> npyHeader = CreateHeaderNPY(shape, std::abs(type), wordSize);
	const size_t nbytes = SizeBytes() + npyHeader.size();

	// get the CRC of the data to be added
	uint32_t crc = crc32(0L, (uint8_t*)npyHeader.data(), (uLong)npyHeader.size());
	crc = crc32(crc, Data(), (uLong)SizeBytes());

	// append NPY extension
	varname += ".npy";

	// build the local header
	std::vector<char> localHeader;
	add(localHeader, "PK"); // first part of signature
	add(localHeader, (uint16_t)0x0403); // second part of signature
	add(localHeader, (uint16_t)20); // min version to extract
	add(localHeader, (uint16_t)0); // general purpose bit flag
	add(localHeader, (uint16_t)0); // compression method
	add(localHeader, (uint16_t)0); // file last mod time
	add(localHeader, (uint16_t)0); // file last mod date
	add(localHeader, (uint32_t)crc); // CRC
	add(localHeader, (uint32_t)nbytes); // compressed size
	add(localHeader, (uint32_t)nbytes); // uncompressed size
	add(localHeader, (uint16_t)varname.size()); // variable name length
	add(localHeader, (uint16_t)0); // extra field length
	add(localHeader, varname);

	// build global header
	add(globalHeader, "PK"); // first part of signature
	add(globalHeader, (uint16_t)0x0201); // second part of signature
	add(globalHeader, (uint16_t)20); // version made by
	globalHeader.insert(globalHeader.end(), localHeader.begin()+4, localHeader.begin()+30);
	add(globalHeader, (uint16_t)0); // file comment length
	add(globalHeader, (uint16_t)0); // disk number where file starts
	add(globalHeader, (uint16_t)0); // internal file attributes
	add(globalHeader, (uint32_t)0); // external file attributes
	add(globalHeader, (uint32_t)globalHeaderOffset); // relative offset of local file header, since it begins where the global header used to begin
	add(globalHeader, varname);

	// build footer
	std::vector<char> footer;
	add(footer, "PK"); // first part of signature
	add(footer, (uint16_t)0x0605); // second part of signature
	add(footer, (uint16_t)0); // number of this disk
	add(footer, (uint16_t)0); // disk where footer starts
	add(footer, (uint16_t)(nrecs+1)); // number of records on this disk
	add(footer, (uint16_t)(nrecs+1)); // total number of records
	add(footer, (uint32_t)globalHeader.size()); // number of bytes of global headers
	add(footer, (uint32_t)(globalHeaderOffset + nbytes + localHeader.size())); // offset of start of global headers, since global header now starts after newly written array
	add(footer, (uint16_t)0); // zip file comment length

	// write everything
	fwrite(localHeader.data(), sizeof(char), localHeader.size(), fp);
	fwrite(npyHeader.data(), sizeof(char), npyHeader.size(), fp);
	fwrite(Data(), wordSize, numValues, fp);
	fwrite(globalHeader.data(), sizeof(char), globalHeader.size(), fp);
	fwrite(footer.data(), sizeof(char), footer.size(), fp);
	fclose(fp);
	return NULL;
}